

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

void divsufsortxx::helper::
     heapsort<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
               (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator SA,
               value_type size)

{
  reference rhs;
  reference rhs_00;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_00;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_01;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_02;
  reference lhs;
  reference lhs_00;
  value_type vVar1;
  value_type vVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  undefined4 extraout_var_01;
  pos_type pVar5;
  BitmapArray<long> *pBVar6;
  long size_00;
  char *in_stack_ffffffffffffff88;
  BitmapArray<long> *in_stack_ffffffffffffff90;
  pos_type in_stack_ffffffffffffff98;
  value_reference local_50;
  value_reference local_40;
  
  pVar5 = SA.pos_;
  pBVar6 = SA.array_;
  size_00 = size;
  if ((size & 1U) == 0) {
    size_00 = size + -1;
    iVar3 = (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6,size_00 / 2 + pVar5,size_00 % 2);
    vVar1 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                      (&Td,CONCAT44(extraout_var,iVar3));
    iVar3 = (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6);
    vVar2 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                      (&Td,CONCAT44(extraout_var_00,iVar3));
    if (vVar1 < vVar2) {
      lhs.pos_ = in_stack_ffffffffffffff98;
      lhs.array_ = in_stack_ffffffffffffff90;
      rhs.pos_ = (pos_type)in_stack_ffffffffffffff88;
      rhs.array_ = (BitmapArray<long> *)0x109f3b;
      bitmap::swap(lhs,rhs);
    }
  }
  lVar4 = size_00 / 2;
  while (0 < lVar4) {
    lVar4 = lVar4 + -1;
    Td_00.m_PA.array_ = Td.m_PA.array_;
    Td_00.m_Td = Td.m_Td;
    Td_00.m_PA.pos_ = Td.m_PA.pos_;
    in_stack_ffffffffffffff88 = Td.m_Td;
    in_stack_ffffffffffffff90 = Td.m_PA.array_;
    in_stack_ffffffffffffff98 = Td.m_PA.pos_;
    fixdown<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator,long>
              (Td_00,SA,lVar4,size_00);
  }
  if ((size & 1U) == 0) {
    lhs_00.pos_ = in_stack_ffffffffffffff98;
    lhs_00.array_ = in_stack_ffffffffffffff90;
    rhs_00.pos_ = (pos_type)in_stack_ffffffffffffff88;
    rhs_00.array_ = (BitmapArray<long> *)0x109f91;
    bitmap::swap(lhs_00,rhs_00);
    Td_01.m_PA.array_ = Td.m_PA.array_;
    Td_01.m_Td = Td.m_Td;
    Td_01.m_PA.pos_ = Td.m_PA.pos_;
    fixdown<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator,long>
              (Td_01,SA,0,size_00);
  }
  while (lVar4 = size_00 + -1, 1 < size_00) {
    iVar3 = (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6,pVar5);
    local_50.array_ = pBVar6;
    local_50.pos_ = pVar5;
    local_40.array_ = pBVar6;
    local_40.pos_ = pVar5 + lVar4;
    bitmap::BitmapArray<long>::value_reference::operator=(&local_50,&local_40);
    Td_02.m_PA.array_ = Td.m_PA.array_;
    Td_02.m_Td = Td.m_Td;
    Td_02.m_PA.pos_ = Td.m_PA.pos_;
    fixdown<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator,long>
              (Td_02,SA,0,lVar4);
    (*(pBVar6->super_Bitmap)._vptr_Bitmap[4])(pBVar6,pVar5 + lVar4,CONCAT44(extraout_var_01,iVar3));
    size_00 = lVar4;
  }
  return;
}

Assistant:

void heapsort(const StringIterator_type Td, SAIterator_type SA,
              typename std::iterator_traits<SAIterator_type>::value_type size) {
  typedef typename std::iterator_traits<SAIterator_type>::value_type pos_type;
  pos_type i, m;
  pos_type t;

  m = size;
  if ((size % 2) == 0) {
    m--;
    if (Td[SA[m / 2]] < Td[SA[m]]) {
      std::iter_swap(SA + m, SA + m / 2);
    }
  }

  for (i = m / 2 - 1; 0 <= i; --i) {
    fixdown(Td, SA, i, m);
  }

  if ((size % 2) == 0) {
    std::iter_swap(SA, SA + m);
    fixdown(Td, SA, pos_type(0), m);
  }

  for (i = m - 1; 0 < i; --i) {
    t = SA[0];
    SA[0] = SA[i];
    fixdown(Td, SA, pos_type(0), i);
    SA[i] = t;
  }
}